

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O1

void missmm(monst *magr,monst *mdef,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *__format;
  char mdef_name [256];
  char buf [256];
  char acStack_228 [256];
  char local_128 [264];
  
  if (vis == '\0') {
    noises(magr,mattk);
    return;
  }
  if (magr->wormno == '\0') {
    if (((viz_array[magr->my][magr->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[magr->my][magr->mx] & 1U) == 0 || ((magr->data->mflags3 & 0x200) == 0))))))
    goto LAB_001c7462;
LAB_001c740d:
    uVar1 = *(uint *)&magr->field_0x60;
    if (((uVar1 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001c7455;
      goto LAB_001c7462;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001c7462;
LAB_001c7455:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001c7462;
  }
  else {
    bVar2 = worm_known(level,magr);
    if (bVar2 != '\0') goto LAB_001c740d;
LAB_001c7462:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(magr,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(magr,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001c75a3;
        iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_001c75dc;
        goto LAB_001c75b3;
      }
    }
    else {
LAB_001c75a3:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_001c75b3:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(magr), bVar2 == '\0')) {
          map_invisible(magr->mx,magr->my);
        }
      }
    }
  }
LAB_001c75dc:
  if (mdef->wormno == '\0') {
    if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0))))))
    goto LAB_001c76ad;
  }
  else {
    bVar2 = worm_known(level,mdef);
    if (bVar2 != '\0') {
LAB_001c76ad:
      uVar1 = *(uint *)&mdef->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) goto LAB_001c76f6;
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c76f6:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001c7881;
      }
    }
  }
  if (((((mdef->data->mflags1 & 0x10000) != 0) ||
       ((poVar4 = which_armor(mdef,4), poVar4 != (obj *)0x0 &&
        (poVar4 = which_armor(mdef,4), poVar4->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar2 = match_warn_of_mon(mdef), bVar2 == '\0')))) {
    map_invisible(mdef->mx,mdef->my);
  }
LAB_001c7881:
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar3 = could_seduce(magr,mdef,mattk);
  if (iVar3 == 0) {
    __format = "%s misses";
  }
  else {
    __format = "%s misses";
    if ((magr->field_0x61 & 1) == 0) {
      __format = "%s pretends to be friendly to";
    }
  }
  pcVar5 = Monnam(magr);
  sprintf(local_128,__format,pcVar5);
  mon_nam_too(acStack_228,mdef,magr);
  pline("%s %s.",local_128,acStack_228);
  return;
}

Assistant:

static void missmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	const char *fmt;
	char buf[BUFSZ], mdef_name[BUFSZ];

	if (vis) {
		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		fmt = (could_seduce(magr,mdef,mattk) && !magr->mcan) ?
			"%s pretends to be friendly to" : "%s misses";
		sprintf(buf, fmt, Monnam(magr));
		pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
	} else  noises(magr, mattk);
}